

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::Combine
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,
          OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  pointer this_00;
  QueryProfiler *this_01;
  
  pLVar1 = input->local_state;
  this_00 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)(input->global_state + 1));
  PhysicalRangeJoin::GlobalSortedTable::Combine(this_00,(LocalSortedTable *)(pLVar1 + 1));
  this_01 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,(PhysicalOperator *)this);
  QueryProfiler::Flush(this_01,&context->thread->profiler);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalPiecewiseMergeJoin::Combine(ExecutionContext &context,
                                                          OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<MergeJoinGlobalState>();
	auto &lstate = input.local_state.Cast<MergeJoinLocalState>();
	gstate.table->Combine(lstate.table);
	auto &client_profiler = QueryProfiler::Get(context.client);

	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	return SinkCombineResultType::FINISHED;
}